

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall powerpc_test_cpu::test_shift(powerpc_test_cpu *this)

{
  uint32_t set_mask;
  powerpc_test_cpu *this_local;
  
  set_mask = bit_field<0,_0>::mask();
  gen_xer_values(this,0,set_mask);
  printf("Testing slw\n");
  test_instruction_RRRSH(this,"slw",0x7c832830);
  printf("Testing slw.\n");
  test_instruction_RRRSH(this,"slw.",0x7c832831);
  printf("Testing sraw\n");
  test_instruction_RRRSH(this,"sraw",0x7c832e30);
  printf("Testing sraw.\n");
  test_instruction_RRRSH(this,"sraw.",0x7c832e31);
  printf("Testing srawi\n");
  test_instruction_RRS__(this,"srawi",0x7c830670);
  printf("Testing srawi.\n");
  test_instruction_RRS__(this,"srawi.",0x7c830671);
  printf("Testing srw\n");
  test_instruction_RRRSH(this,"srw",0x7c832c30);
  printf("Testing srw.\n");
  test_instruction_RRRSH(this,"srw.",0x7c832c31);
  return;
}

Assistant:

void powerpc_test_cpu::test_shift(void)
{
#if TEST_SHIFT
	gen_xer_values(0, SO);
	TEST_INSTRUCTION(RRRSH,"slw",		_X (31,RA,RD,RB, 24,0));
	TEST_INSTRUCTION(RRRSH,"slw.",		_X (31,RA,RD,RB, 24,1));
	TEST_INSTRUCTION(RRRSH,"sraw",		_X (31,RA,RD,RB,792,0));
	TEST_INSTRUCTION(RRRSH,"sraw.",		_X (31,RA,RD,RB,792,1));
	TEST_INSTRUCTION(RRS__,"srawi",		_X (31,RA,RD,00,824,0));
	TEST_INSTRUCTION(RRS__,"srawi.",	_X (31,RA,RD,00,824,1));
	TEST_INSTRUCTION(RRRSH,"srw",		_X (31,RA,RD,RB,536,0));
	TEST_INSTRUCTION(RRRSH,"srw.",		_X (31,RA,RD,RB,536,1));
#endif
}